

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<Vector3<double>,int>::
     move<std::allocator<std::pair<Vector3<double>const,int>>>
               (allocator<std::pair<const_Vector3<double>,_int>_> *alloc,
               slot_type<Vector3<double>,_int> *src,slot_type<Vector3<double>,_int> *dest)

{
  slot_type<Vector3<double>,_int> *dest_local;
  slot_type<Vector3<double>,_int> *src_local;
  allocator<std::pair<const_Vector3<double>,_int>_> *alloc_local;
  
  std::pair<Vector3<double>,_int>::operator=
            ((pair<Vector3<double>,_int> *)&dest->value,(type)&src->value);
  return;
}

Assistant:

static void move(Allocator* alloc, slot_type* src, slot_type* dest) {
    if (kMutableKeys::value) {
      dest->mutable_value = std::move(src->mutable_value);
    } else {
      absl::allocator_traits<Allocator>::destroy(*alloc, &dest->value);
      absl::allocator_traits<Allocator>::construct(*alloc, &dest->value,
                                                   std::move(src->value));
    }
  }